

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

RegexStacks * __thiscall Js::ScriptContext::AllocRegexStacks(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  RegexStacks *this_00;
  PageAllocator *pageAllocator;
  TrackAllocData local_40;
  RegexStacks *stacks;
  ScriptContext *this_local;
  
  stacks = (RegexStacks *)this;
  if (this->regexStacks != (RegexStacks *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x4be,"(this->regexStacks == nullptr)",
                                "this->regexStacks == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pAVar4 = &RegexAllocator(this)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&UnifiedRegex::RegexStacks::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x4bf);
  pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar4,&local_40);
  this_00 = (RegexStacks *)new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar4,0x3f67b0);
  pageAllocator = ThreadContext::GetPageAllocator(this->threadContext);
  UnifiedRegex::RegexStacks::RegexStacks(this_00,pageAllocator);
  this->regexStacks = this_00;
  return this_00;
}

Assistant:

UnifiedRegex::RegexStacks * ScriptContext::AllocRegexStacks()
    {
        Assert(this->regexStacks == nullptr);
        UnifiedRegex::RegexStacks * stacks = Anew(RegexAllocator(), UnifiedRegex::RegexStacks, threadContext->GetPageAllocator());
        this->regexStacks = stacks;
        return stacks;
    }